

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddArrayContainer
          (ContainerMetadataCollection *this,idx_t amount,bool is_inverted)

{
  uchar local_19;
  
  AddContainerType(this,false,is_inverted);
  local_19 = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(amount);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             &local_19);
  this->arrays_in_segment = this->arrays_in_segment + 1;
  this->count_in_segment = this->count_in_segment + 1;
  return;
}

Assistant:

void ContainerMetadataCollection::AddArrayContainer(idx_t amount, bool is_inverted) {
	AddContainerType(false, is_inverted);
	D_ASSERT(amount < MAX_ARRAY_IDX);
	cardinality.push_back(NumericCast<uint8_t>(amount));
	arrays_in_segment++;
	count_in_segment++;
}